

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

size_t __thiscall google::protobuf::UninterpretedOption::ByteSizeLong(UninterpretedOption *this)

{
  long lVar1;
  Rep *pRVar2;
  size_type sVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  void **ppvVar11;
  
  sVar10 = (size_t)(this->name_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->name_).super_RepeatedPtrFieldBase.rep_;
  ppvVar11 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar11 = (void **)0x0;
  }
  if (sVar10 != 0) {
    lVar1 = sVar10 * 8;
    lVar9 = 0;
    do {
      sVar6 = UninterpretedOption_NamePart::ByteSizeLong
                        (*(UninterpretedOption_NamePart **)((long)ppvVar11 + lVar9));
      uVar5 = (uint)sVar6 | 1;
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar10 = sVar10 + sVar6 + (ulong)(iVar4 * 9 + 0x49U >> 6);
      lVar9 = lVar9 + 8;
    } while (lVar1 - lVar9 != 0);
  }
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((uVar5 & 0x3f) != 0) {
    if ((uVar5 & 1) != 0) {
      sVar3 = ((this->identifier_value_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar10 = sVar10 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 2) != 0) {
      sVar3 = ((this->string_value_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar10 = sVar10 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 4) != 0) {
      sVar3 = ((this->aggregate_value_).ptr_)->_M_string_length;
      uVar7 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar10 = sVar10 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 8) != 0) {
      uVar8 = this->positive_int_value_ | 1;
      lVar1 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar10 = sVar10 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 0x10) != 0) {
      uVar8 = this->negative_int_value_ | 1;
      lVar1 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar10 = sVar10 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar5 & 0x20) != 0) {
      sVar10 = sVar10 + 9;
    }
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar10;
    return sVar10;
  }
  sVar10 = internal::ComputeUnknownFieldsSize
                     (&this->_internal_metadata_,sVar10,&this->_cached_size_);
  return sVar10;
}

Assistant:

size_t UninterpretedOption::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.UninterpretedOption)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  total_size += 1UL * this->_internal_name_size();
  for (const auto& msg : this->name_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000003fu) {
    // optional string identifier_value = 3;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_identifier_value());
    }

    // optional bytes string_value = 7;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::BytesSize(
          this->_internal_string_value());
    }

    // optional string aggregate_value = 8;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_aggregate_value());
    }

    // optional uint64 positive_int_value = 4;
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64Size(
          this->_internal_positive_int_value());
    }

    // optional int64 negative_int_value = 5;
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int64Size(
          this->_internal_negative_int_value());
    }

    // optional double double_value = 6;
    if (cached_has_bits & 0x00000020u) {
      total_size += 1 + 8;
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}